

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O1

void xmrig::cryptonight_quad_hash<true>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  cryptonight_ctx *pcVar31;
  cryptonight_ctx *pcVar32;
  uint8_t *puVar33;
  uint8_t *puVar34;
  cryptonight_ctx *pcVar35;
  uint8_t *puVar36;
  cryptonight_ctx *pcVar37;
  uint8_t *puVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  ulong uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  size_t i;
  long lVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  long lVar77;
  ulong uVar78;
  ulong uVar79;
  long lVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  long lVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  double dVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  ulong local_1d8;
  ulong uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  ulong local_1a8;
  ulong local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  undefined8 local_f8;
  uint uStack_f0;
  uint uStack_ec;
  ulong local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  
  lVar73 = 0;
  do {
    pcVar31 = ctx[lVar73];
    keccak(input,(int)size,pcVar31->state,200);
    cn_explode_scratchpad<true>((__m128i *)pcVar31,(__m128i *)pcVar31->memory);
    lVar73 = lVar73 + 1;
    input = input + size;
  } while (lVar73 != 4);
  pcVar31 = *ctx;
  pcVar32 = ctx[1];
  puVar33 = pcVar31->memory;
  puVar34 = pcVar32->memory;
  pcVar35 = ctx[2];
  puVar36 = pcVar35->memory;
  pcVar37 = ctx[3];
  puVar38 = pcVar37->memory;
  local_e8 = *(ulong *)(pcVar31->state + 0x60);
  lVar73 = *(long *)(pcVar31->state + 0x68);
  uVar78 = *(ulong *)pcVar31->state;
  uVar85 = *(ulong *)(pcVar31->state + 8);
  uVar86 = *(ulong *)(pcVar31->state + 0x10);
  uVar1 = *(ulong *)(pcVar31->state + 0x18);
  uVar79 = *(ulong *)(pcVar31->state + 0x20);
  uVar88 = *(ulong *)(pcVar31->state + 0x28);
  uVar2 = *(ulong *)(pcVar31->state + 0x30);
  uVar52 = *(ulong *)(pcVar31->state + 0x38);
  uVar53 = *(undefined8 *)(pcVar31->state + 0x40);
  uVar54 = *(undefined8 *)(pcVar31->state + 0x48);
  uVar55 = *(undefined8 *)(pcVar31->state + 0x50);
  uVar56 = *(undefined8 *)(pcVar31->state + 0x58);
  local_198 = *(ulong *)(pcVar32->state + 0x60);
  lVar89 = *(long *)(pcVar32->state + 0x68);
  uVar102 = *(ulong *)pcVar32->state;
  uVar103 = *(ulong *)(pcVar32->state + 8);
  uVar57 = *(undefined8 *)(pcVar32->state + 0x10);
  uVar58 = *(undefined8 *)(pcVar32->state + 0x18);
  uVar98 = *(ulong *)(pcVar32->state + 0x20);
  uVar99 = *(ulong *)(pcVar32->state + 0x28);
  uVar59 = *(undefined8 *)(pcVar32->state + 0x30);
  uVar60 = *(undefined8 *)(pcVar32->state + 0x38);
  uVar61 = *(undefined8 *)(pcVar32->state + 0x40);
  uVar62 = *(undefined8 *)(pcVar32->state + 0x48);
  uVar63 = *(undefined8 *)(pcVar32->state + 0x50);
  uVar64 = *(undefined8 *)(pcVar32->state + 0x58);
  uVar75 = *(ulong *)(pcVar35->state + 0x60);
  lVar77 = *(long *)(pcVar35->state + 0x68);
  uVar96 = *(ulong *)pcVar35->state;
  uVar97 = *(ulong *)(pcVar35->state + 8);
  uVar101 = *(ulong *)(pcVar35->state + 0x10);
  uVar68 = *(ulong *)(pcVar35->state + 0x18);
  uVar94 = *(ulong *)(pcVar35->state + 0x20);
  uVar95 = *(ulong *)(pcVar35->state + 0x28);
  uVar72 = *(ulong *)(pcVar35->state + 0x30);
  uVar67 = *(ulong *)(pcVar35->state + 0x38);
  local_1a8 = *(ulong *)(pcVar37->state + 0x60);
  lVar80 = *(long *)(pcVar37->state + 0x68);
  uVar71 = *(ulong *)(pcVar35->state + 0x40);
  uVar66 = *(ulong *)(pcVar35->state + 0x48);
  uVar69 = *(ulong *)(pcVar35->state + 0x50);
  uVar70 = *(ulong *)(pcVar35->state + 0x58);
  uVar74 = *(ulong *)pcVar37->state;
  uVar76 = *(ulong *)(pcVar37->state + 8);
  uVar81 = *(ulong *)(pcVar37->state + 0x10);
  uVar82 = *(ulong *)(pcVar37->state + 0x18);
  uVar104 = *(ulong *)(pcVar37->state + 0x20);
  uVar106 = *(ulong *)(pcVar37->state + 0x28);
  uVar83 = *(ulong *)(pcVar37->state + 0x30);
  uVar84 = *(ulong *)(pcVar37->state + 0x38);
  uVar87 = *(ulong *)(pcVar37->state + 0x40);
  uVar90 = *(ulong *)(pcVar37->state + 0x48);
  uVar91 = *(ulong *)(pcVar37->state + 0x50);
  uVar92 = *(ulong *)(pcVar37->state + 0x58);
  fesetround(0x400);
  uVar65 = extra_iters + 0x40000 >> 1 & 0xffffffff;
  if (uVar65 != 0) {
    uVar104 = uVar104 ^ uVar74;
    uVar106 = uVar106 ^ uVar76;
    uVar94 = uVar94 ^ uVar96;
    uVar95 = uVar95 ^ uVar97;
    local_d8._0_4_ = (uint)uVar63;
    local_d8._4_4_ = (uint)((ulong)uVar63 >> 0x20);
    uStack_d0._0_4_ = (uint)uVar64;
    uStack_d0._4_4_ = (uint)((ulong)uVar64 >> 0x20);
    local_148 = (uint)uVar61;
    uStack_144 = (uint)((ulong)uVar61 >> 0x20);
    uStack_140 = (uint)uVar62;
    uStack_13c = (uint)((ulong)uVar62 >> 0x20);
    local_d8 = CONCAT44(local_d8._4_4_ ^ uStack_144,(uint)local_d8 ^ local_148);
    uStack_d0 = CONCAT44(uStack_d0._4_4_ ^ uStack_13c,(uint)uStack_d0 ^ uStack_140);
    local_188._0_4_ = (uint)uVar59;
    local_188._4_4_ = (uint)((ulong)uVar59 >> 0x20);
    uStack_180._0_4_ = (uint)uVar60;
    uStack_180._4_4_ = (uint)((ulong)uVar60 >> 0x20);
    local_f8._0_4_ = (uint)uVar57;
    local_f8._4_4_ = (uint)((ulong)uVar57 >> 0x20);
    uStack_f0 = (uint)uVar58;
    uStack_ec = (uint)((ulong)uVar58 >> 0x20);
    local_188 = CONCAT44(local_188._4_4_ ^ local_f8._4_4_,(uint)local_188 ^ (uint)local_f8);
    uStack_180 = CONCAT44(uStack_180._4_4_ ^ uStack_ec,(uint)uStack_180 ^ uStack_f0);
    uVar98 = uVar98 ^ uVar102;
    uVar99 = uVar99 ^ uVar103;
    local_1c8._0_4_ = (uint)uVar55;
    local_1c8._4_4_ = (uint)((ulong)uVar55 >> 0x20);
    uStack_1c0._0_4_ = (uint)uVar56;
    uStack_1c0._4_4_ = (uint)((ulong)uVar56 >> 0x20);
    local_128 = (uint)uVar53;
    uStack_124 = (uint)((ulong)uVar53 >> 0x20);
    uStack_120 = (uint)uVar54;
    uStack_11c = (uint)((ulong)uVar54 >> 0x20);
    local_1c8 = CONCAT44(local_1c8._4_4_ ^ uStack_124,(uint)local_1c8 ^ local_128);
    uStack_1c0 = CONCAT44(uStack_1c0._4_4_ ^ uStack_11c,(uint)uStack_1c0 ^ uStack_120);
    uVar79 = uVar79 ^ uVar78;
    uVar88 = uVar88 ^ uVar85;
    uVar78 = uVar83 ^ uVar81;
    uVar85 = uVar84 ^ uVar82;
    uVar102 = uVar91 ^ uVar87;
    uVar103 = uVar92 ^ uVar90;
    uVar96 = uVar72 ^ uVar101;
    uVar97 = uVar67 ^ uVar68;
    uVar101 = uVar69 ^ uVar71;
    uVar68 = uVar70 ^ uVar66;
    local_1d8 = uVar2 ^ uVar86;
    uStack_1d0 = uVar52 ^ uVar1;
    local_f8 = uVar75;
    do {
      uVar108 = uVar97;
      uVar107 = uVar96;
      uVar110 = uVar85;
      uVar109 = uVar78;
      uVar86 = uVar79 & 0xffff0;
      uVar3 = *(uint *)(puVar33 + uVar86);
      uVar4 = *(uint *)(puVar33 + uVar86 + 4);
      uVar5 = *(uint *)(puVar33 + uVar86 + 8);
      uVar6 = *(uint *)(puVar33 + uVar86 + 0xc);
      uVar7 = saes_table[1][uVar6 >> 8 & 0xff];
      uVar8 = saes_table[0][uVar5 & 0xff];
      uVar9 = saes_table[1][uVar3 >> 8 & 0xff];
      uVar10 = saes_table[0][uVar6 & 0xff];
      uVar11 = *(uint *)((long)saes_table[2] + (ulong)(uVar3 >> 0xe & 0x3fc));
      uVar12 = *(uint *)((long)saes_table[2] + (ulong)(uVar4 >> 0xe & 0x3fc));
      uVar13 = *(uint *)((long)saes_table[3] + (ulong)(uVar4 >> 0x16 & 0xfffffffc));
      uVar14 = *(uint *)((long)saes_table[3] + (ulong)(uVar5 >> 0x16 & 0xfffffffc));
      uVar15 = saes_table[1][uVar4 >> 8 & 0xff];
      uVar16 = saes_table[0][uVar3 & 0xff];
      uVar17 = saes_table[1][uVar5 >> 8 & 0xff];
      uVar4 = saes_table[0][uVar4 & 0xff];
      uVar5 = *(uint *)((long)saes_table[2] + (ulong)(uVar5 >> 0xe & 0x3fc));
      uVar18 = *(uint *)((long)saes_table[2] + (ulong)(uVar6 >> 0xe & 0x3fc));
      uVar6 = *(uint *)((long)saes_table[3] + (ulong)(uVar6 >> 0x16 & 0xfffffffc));
      uVar3 = *(uint *)((long)saes_table[3] + (ulong)(uVar3 >> 0x16 & 0xfffffffc));
      uVar85 = uVar98 & 0xffff0;
      uVar78 = uVar94 & 0xffff0;
      uVar75 = uVar104 & 0xffff0;
      uVar19 = *(uint *)(puVar34 + uVar85);
      uVar20 = *(uint *)(puVar34 + uVar85 + 4);
      uVar21 = *(uint *)(puVar34 + uVar85 + 8);
      uVar22 = *(uint *)(puVar34 + uVar85 + 0xc);
      uVar23 = *(uint *)(puVar36 + uVar78);
      uVar24 = *(uint *)(puVar36 + uVar78 + 4);
      uVar25 = *(uint *)(puVar36 + uVar78 + 8);
      lVar47 = *(long *)((long)(puVar33 + (uVar86 ^ 0x30)) + 8);
      uVar26 = *(uint *)(puVar36 + uVar78 + 0xc);
      uVar27 = *(uint *)(puVar38 + uVar75);
      uVar28 = *(uint *)(puVar38 + uVar75 + 4);
      uVar29 = *(uint *)(puVar38 + uVar75 + 8);
      uVar30 = *(uint *)(puVar38 + uVar75 + 0xc);
      lVar48 = *(long *)(puVar33 + (uVar86 ^ 0x10));
      lVar49 = *(long *)((long)(puVar33 + (uVar86 ^ 0x10)) + 8);
      lVar50 = *(long *)(puVar33 + (uVar86 ^ 0x20));
      lVar51 = *(long *)((long)(puVar33 + (uVar86 ^ 0x20)) + 8);
      *(ulong *)(puVar33 + (uVar86 ^ 0x10)) = *(long *)(puVar33 + (uVar86 ^ 0x30)) + local_1c8;
      *(ulong *)((long)(puVar33 + (uVar86 ^ 0x10)) + 8) = lVar47 + uStack_1c0;
      *(ulong *)(puVar33 + (uVar86 ^ 0x20)) = lVar48 + local_1d8;
      *(ulong *)((long)(puVar33 + (uVar86 ^ 0x20)) + 8) = lVar49 + uStack_1d0;
      *(ulong *)(puVar33 + (uVar86 ^ 0x30)) = lVar50 + uVar79;
      *(ulong *)((long)(puVar33 + (uVar86 ^ 0x30)) + 8) = lVar51 + uVar88;
      uVar92 = CONCAT44(uVar17 ^ uVar4 ^ uVar18 ^ uVar3,uVar15 ^ uVar16 ^ uVar5 ^ uVar6) ^ uVar79;
      uVar93 = CONCAT44(uVar9 ^ uVar10 ^ uVar12 ^ uVar14,uVar7 ^ uVar8 ^ uVar11 ^ uVar13) ^ uVar88;
      *(ulong *)(puVar33 + uVar86) = uVar92 ^ local_1d8;
      *(ulong *)((long)(puVar33 + uVar86) + 8) = uVar93 ^ uStack_1d0;
      uVar3 = saes_table[1][uVar20 >> 8 & 0xff];
      uVar4 = saes_table[0][uVar19 & 0xff];
      uVar5 = saes_table[1][uVar21 >> 8 & 0xff];
      uVar6 = saes_table[0][uVar20 & 0xff];
      uVar7 = saes_table[1][uVar22 >> 8 & 0xff];
      uVar8 = saes_table[0][uVar21 & 0xff];
      uVar9 = saes_table[1][uVar19 >> 8 & 0xff];
      uVar10 = saes_table[0][uVar22 & 0xff];
      uVar11 = *(uint *)((long)saes_table[2] + (ulong)(uVar21 >> 0xe & 0x3fc));
      uVar12 = *(uint *)((long)saes_table[2] + (ulong)(uVar22 >> 0xe & 0x3fc));
      uVar13 = *(uint *)((long)saes_table[2] + (ulong)(uVar19 >> 0xe & 0x3fc));
      uVar14 = *(uint *)((long)saes_table[2] + (ulong)(uVar20 >> 0xe & 0x3fc));
      uVar15 = *(uint *)((long)saes_table[3] + (ulong)(uVar20 >> 0x16 & 0xfffffffc));
      uVar16 = *(uint *)((long)saes_table[3] + (ulong)(uVar21 >> 0x16 & 0xfffffffc));
      uVar17 = *(uint *)((long)saes_table[3] + (ulong)(uVar22 >> 0x16 & 0xfffffffc));
      uVar18 = *(uint *)((long)saes_table[3] + (ulong)(uVar19 >> 0x16 & 0xfffffffc));
      lVar47 = *(long *)((long)(puVar34 + (uVar85 ^ 0x30)) + 8);
      lVar48 = *(long *)(puVar34 + (uVar85 ^ 0x10));
      lVar49 = *(long *)((long)(puVar34 + (uVar85 ^ 0x10)) + 8);
      lVar50 = *(long *)(puVar34 + (uVar85 ^ 0x20));
      lVar51 = *(long *)((long)(puVar34 + (uVar85 ^ 0x20)) + 8);
      *(ulong *)(puVar34 + (uVar85 ^ 0x10)) = *(long *)(puVar34 + (uVar85 ^ 0x30)) + local_d8;
      *(ulong *)((long)(puVar34 + (uVar85 ^ 0x10)) + 8) = lVar47 + uStack_d0;
      *(ulong *)(puVar34 + (uVar85 ^ 0x20)) = lVar48 + local_188;
      *(ulong *)((long)(puVar34 + (uVar85 ^ 0x20)) + 8) = lVar49 + uStack_180;
      *(ulong *)(puVar34 + (uVar85 ^ 0x30)) = lVar50 + uVar98;
      *(ulong *)((long)(puVar34 + (uVar85 ^ 0x30)) + 8) = lVar51 + uVar99;
      uVar90 = CONCAT44(uVar5 ^ uVar6 ^ uVar12 ^ uVar18,uVar3 ^ uVar4 ^ uVar11 ^ uVar17) ^ uVar98;
      uVar91 = CONCAT44(uVar9 ^ uVar10 ^ uVar14 ^ uVar16,uVar7 ^ uVar8 ^ uVar13 ^ uVar15) ^ uVar99;
      *(ulong *)(puVar34 + uVar85) = uVar90 ^ local_188;
      *(ulong *)((long)(puVar34 + uVar85) + 8) = uVar91 ^ uStack_180;
      uVar3 = saes_table[1][uVar26 >> 8 & 0xff];
      uVar4 = saes_table[0][uVar25 & 0xff];
      uVar5 = saes_table[1][uVar23 >> 8 & 0xff];
      uVar6 = saes_table[0][uVar26 & 0xff];
      uVar7 = *(uint *)((long)saes_table[2] + (ulong)(uVar23 >> 0xe & 0x3fc));
      uVar8 = *(uint *)((long)saes_table[2] + (ulong)(uVar24 >> 0xe & 0x3fc));
      uVar9 = *(uint *)((long)saes_table[3] + (ulong)(uVar24 >> 0x16 & 0x3fc));
      uVar10 = *(uint *)((long)saes_table[3] + (ulong)(uVar25 >> 0x16 & 0xfffffffc));
      uVar11 = saes_table[1][uVar24 >> 8 & 0xff];
      uVar12 = saes_table[0][uVar23 & 0xff];
      uVar13 = saes_table[1][uVar25 >> 8 & 0xff];
      uVar14 = saes_table[0][uVar24 & 0xff];
      uVar15 = *(uint *)((long)saes_table[2] + (ulong)(uVar25 >> 0xe & 0x3fc));
      uVar16 = *(uint *)((long)saes_table[2] + (ulong)(uVar26 >> 0xe & 0x3fc));
      uVar17 = *(uint *)((long)saes_table[3] + (ulong)(uVar26 >> 0x16 & 0xfffffffc));
      uVar18 = *(uint *)((long)saes_table[3] + (ulong)(uVar23 >> 0x16 & 0x3fc));
      lVar47 = *(long *)((long)(puVar36 + (uVar78 ^ 0x30)) + 8);
      lVar48 = *(long *)(puVar36 + (uVar78 ^ 0x10));
      lVar49 = *(long *)((long)(puVar36 + (uVar78 ^ 0x10)) + 8);
      lVar50 = *(long *)(puVar36 + (uVar78 ^ 0x20));
      lVar51 = *(long *)((long)(puVar36 + (uVar78 ^ 0x20)) + 8);
      *(ulong *)(puVar36 + (uVar78 ^ 0x10)) = *(long *)(puVar36 + (uVar78 ^ 0x30)) + uVar101;
      *(ulong *)((long)(puVar36 + (uVar78 ^ 0x10)) + 8) = lVar47 + uVar68;
      *(ulong *)(puVar36 + (uVar78 ^ 0x20)) = lVar48 + uVar107;
      *(ulong *)((long)(puVar36 + (uVar78 ^ 0x20)) + 8) = lVar49 + uVar108;
      *(ulong *)(puVar36 + (uVar78 ^ 0x30)) = lVar50 + uVar94;
      *(ulong *)((long)(puVar36 + (uVar78 ^ 0x30)) + 8) = lVar51 + uVar95;
      uVar96 = CONCAT44(uVar13 ^ uVar14 ^ uVar16 ^ uVar18,uVar11 ^ uVar12 ^ uVar15 ^ uVar17) ^
               uVar94;
      uVar97 = CONCAT44(uVar5 ^ uVar6 ^ uVar8 ^ uVar10,uVar3 ^ uVar4 ^ uVar7 ^ uVar9) ^ uVar95;
      *(ulong *)(puVar36 + uVar78) = uVar96 ^ uVar107;
      *(ulong *)((long)(puVar36 + uVar78) + 8) = uVar97 ^ uVar108;
      uVar3 = saes_table[1][uVar30 >> 8 & 0xff];
      uVar4 = saes_table[0][uVar29 & 0xff];
      uVar5 = saes_table[1][uVar27 >> 8 & 0xff];
      uVar6 = saes_table[0][uVar30 & 0xff];
      uVar7 = *(uint *)((long)saes_table[2] + (ulong)(uVar27 >> 0xe & 0x3fc));
      uVar8 = *(uint *)((long)saes_table[2] + (ulong)(uVar28 >> 0xe & 0x3fc));
      uVar9 = *(uint *)((long)saes_table[3] + (ulong)(uVar28 >> 0x16 & 0xfffffffc));
      uVar10 = *(uint *)((long)saes_table[3] + (ulong)(uVar29 >> 0x16 & 0x3fc));
      uVar11 = saes_table[1][uVar28 >> 8 & 0xff];
      uVar12 = saes_table[0][uVar27 & 0xff];
      uVar13 = saes_table[1][uVar29 >> 8 & 0xff];
      uVar14 = saes_table[0][uVar28 & 0xff];
      uVar15 = *(uint *)((long)saes_table[2] + (ulong)(uVar29 >> 0xe & 0x3fc));
      uVar16 = *(uint *)((long)saes_table[2] + (ulong)(uVar30 >> 0xe & 0x3fc));
      uVar17 = *(uint *)((long)saes_table[3] + (ulong)(uVar30 >> 0x16 & 0xfffffffc));
      uVar18 = *(uint *)((long)saes_table[3] + (ulong)(uVar27 >> 0x16 & 0x3fc));
      lVar47 = *(long *)((long)(puVar38 + (uVar75 ^ 0x30)) + 8);
      lVar48 = *(long *)(puVar38 + (uVar75 ^ 0x10));
      lVar49 = *(long *)((long)(puVar38 + (uVar75 ^ 0x10)) + 8);
      lVar50 = *(long *)(puVar38 + (uVar75 ^ 0x20));
      lVar51 = *(long *)((long)(puVar38 + (uVar75 ^ 0x20)) + 8);
      *(ulong *)(puVar38 + (uVar75 ^ 0x10)) = *(long *)(puVar38 + (uVar75 ^ 0x30)) + uVar102;
      *(ulong *)((long)(puVar38 + (uVar75 ^ 0x10)) + 8) = lVar47 + uVar103;
      *(ulong *)(puVar38 + (uVar75 ^ 0x20)) = lVar48 + uVar109;
      *(ulong *)((long)(puVar38 + (uVar75 ^ 0x20)) + 8) = lVar49 + uVar110;
      *(ulong *)(puVar38 + (uVar75 ^ 0x30)) = lVar50 + uVar104;
      *(ulong *)((long)(puVar38 + (uVar75 ^ 0x30)) + 8) = lVar51 + uVar106;
      uVar78 = CONCAT44(uVar13 ^ uVar14 ^ uVar16 ^ uVar18,uVar11 ^ uVar12 ^ uVar15 ^ uVar17) ^
               uVar104;
      uVar85 = CONCAT44(uVar5 ^ uVar6 ^ uVar8 ^ uVar10,uVar3 ^ uVar4 ^ uVar7 ^ uVar9) ^ uVar106;
      *(ulong *)(puVar38 + uVar75) = uVar78 ^ uVar109;
      *(ulong *)((long)(puVar38 + uVar75) + 8) = uVar85 ^ uVar110;
      uVar82 = uVar92 & 0xffff0;
      uVar83 = lVar73 << 0x20 ^ local_e8 ^ *(ulong *)(puVar33 + uVar82);
      uVar75 = (ulong)((int)uVar92 + (int)lVar73 * 2 & 0x7ffffffe) | 0x80000001;
      local_e8 = uVar93 % uVar75 << 0x20 | uVar93 / uVar75 & 0xffffffff;
      dVar100 = SQRT((double)(local_e8 + uVar92 >> 0xc | 0x3ff0000000000000));
      uVar75 = (ulong)dVar100 >> 0x14;
      uVar86 = (ulong)dVar100 >> 0x13;
      uVar74 = uVar90 & 0xffff0;
      uVar76 = uVar96 & 0xffff0;
      uVar84 = uVar78 & 0xffff0;
      lVar73 = uVar86 + (((uVar86 - uVar75) + -0x3fdffffffff) * (uVar75 - 0x3fe00000000) <
                        local_e8 + uVar92);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar83;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar92;
      uVar69 = SUB168(auVar39 * auVar43,8);
      uVar66 = SUB168(auVar39 * auVar43,0);
      uVar52 = *(ulong *)(puVar33 + (uVar82 ^ 0x20));
      uVar72 = *(ulong *)((long)(puVar33 + (uVar82 ^ 0x20)) + 8);
      uVar67 = *(ulong *)(puVar33 + (uVar82 ^ 0x10));
      uVar71 = *(ulong *)((long)(puVar33 + (uVar82 ^ 0x10)) + 8);
      lVar47 = *(long *)((long)(puVar33 + (uVar82 ^ 0x30)) + 8);
      uVar81 = lVar89 << 0x20 ^ local_198 ^ *(ulong *)(puVar34 + uVar74);
      uVar87 = lVar77 << 0x20 ^ local_f8 ^ *(ulong *)(puVar36 + uVar76);
      uVar70 = lVar80 << 0x20 ^ local_1a8 ^ *(ulong *)(puVar38 + uVar84);
      uVar75 = *(ulong *)(puVar33 + uVar82 + 8);
      uVar86 = *(ulong *)(puVar34 + uVar74 + 8);
      uVar1 = *(ulong *)(puVar36 + uVar76 + 8);
      uVar2 = *(ulong *)(puVar38 + uVar84 + 8);
      *(ulong *)(puVar33 + (uVar82 ^ 0x10)) = local_1c8 + *(long *)(puVar33 + (uVar82 ^ 0x30));
      *(ulong *)((long)(puVar33 + (uVar82 ^ 0x10)) + 8) = uStack_1c0 + lVar47;
      local_1c8 = local_1d8;
      uStack_1c0 = uStack_1d0;
      *(ulong *)(puVar33 + (uVar82 ^ 0x20)) = (uVar69 ^ uVar67) + local_1d8;
      *(ulong *)((long)(puVar33 + (uVar82 ^ 0x20)) + 8) = (uVar66 ^ uVar71) + uStack_1d0;
      uVar69 = (uVar52 ^ uVar69) + uVar79;
      uVar66 = (uVar72 ^ uVar66) + uVar88;
      *(ulong *)(puVar33 + (uVar82 ^ 0x30)) = uVar52 + uVar79;
      *(ulong *)((long)(puVar33 + (uVar82 ^ 0x30)) + 8) = uVar72 + uVar88;
      *(ulong *)(puVar33 + uVar82) = uVar69;
      *(ulong *)((long)(puVar33 + uVar82) + 8) = uVar66;
      uVar79 = (ulong)((int)uVar90 + (int)lVar89 * 2 & 0x7ffffffe) | 0x80000001;
      local_198 = uVar91 % uVar79 << 0x20 | uVar91 / uVar79 & 0xffffffff;
      dVar100 = SQRT((double)(local_198 + uVar90 >> 0xc | 0x3ff0000000000000));
      uVar79 = (ulong)dVar100 >> 0x14;
      uVar88 = (ulong)dVar100 >> 0x13;
      lVar89 = uVar88 + (((uVar88 - uVar79) + -0x3fdffffffff) * (uVar79 - 0x3fe00000000) <
                        local_198 + uVar90);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar81;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar90;
      uVar71 = SUB168(auVar40 * auVar44,8);
      uVar67 = SUB168(auVar40 * auVar44,0);
      uVar79 = *(ulong *)(puVar34 + (uVar74 ^ 0x20));
      uVar88 = *(ulong *)((long)(puVar34 + (uVar74 ^ 0x20)) + 8);
      lVar47 = *(long *)((long)(puVar34 + (uVar74 ^ 0x30)) + 8);
      uVar52 = *(ulong *)(puVar34 + (uVar74 ^ 0x10));
      uVar72 = *(ulong *)((long)(puVar34 + (uVar74 ^ 0x10)) + 8);
      *(ulong *)(puVar34 + (uVar74 ^ 0x10)) = local_d8 + *(long *)(puVar34 + (uVar74 ^ 0x30));
      *(ulong *)((long)(puVar34 + (uVar74 ^ 0x10)) + 8) = uStack_d0 + lVar47;
      local_d8 = local_188;
      uStack_d0 = uStack_180;
      *(ulong *)(puVar34 + (uVar74 ^ 0x20)) = (uVar71 ^ uVar52) + local_188;
      *(ulong *)((long)(puVar34 + (uVar74 ^ 0x20)) + 8) = (uVar67 ^ uVar72) + uStack_180;
      uVar82 = (uVar79 ^ uVar71) + uVar98;
      uVar105 = (uVar88 ^ uVar67) + uVar99;
      *(ulong *)(puVar34 + (uVar74 ^ 0x30)) = uVar79 + uVar98;
      *(ulong *)((long)(puVar34 + (uVar74 ^ 0x30)) + 8) = uVar88 + uVar99;
      uVar79 = (ulong)((int)uVar96 + (int)lVar77 * 2 & 0x7ffffffe) | 0x80000001;
      *(ulong *)(puVar34 + uVar74) = uVar82;
      *(ulong *)((long)(puVar34 + uVar74) + 8) = uVar105;
      local_f8 = uVar97 % uVar79 << 0x20 | uVar97 / uVar79 & 0xffffffff;
      dVar100 = SQRT((double)(local_f8 + uVar96 >> 0xc | 0x3ff0000000000000));
      uVar79 = (ulong)dVar100 >> 0x14;
      uVar88 = (ulong)dVar100 >> 0x13;
      lVar77 = uVar88 + (((uVar88 - uVar79) + -0x3fdffffffff) * (uVar79 - 0x3fe00000000) <
                        local_f8 + uVar96);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar87;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar96;
      uVar71 = SUB168(auVar41 * auVar45,8);
      uVar67 = SUB168(auVar41 * auVar45,0);
      uVar52 = *(ulong *)(puVar36 + (uVar76 ^ 0x20));
      uVar72 = *(ulong *)((long)(puVar36 + (uVar76 ^ 0x20)) + 8);
      uVar79 = *(ulong *)(puVar36 + (uVar76 ^ 0x10));
      uVar88 = *(ulong *)((long)(puVar36 + (uVar76 ^ 0x10)) + 8);
      lVar47 = *(long *)((long)(puVar36 + (uVar76 ^ 0x30)) + 8);
      *(ulong *)(puVar36 + (uVar76 ^ 0x10)) = uVar101 + *(long *)(puVar36 + (uVar76 ^ 0x30));
      *(ulong *)((long)(puVar36 + (uVar76 ^ 0x10)) + 8) = uVar68 + lVar47;
      *(ulong *)(puVar36 + (uVar76 ^ 0x20)) = (uVar71 ^ uVar79) + uVar107;
      *(ulong *)((long)(puVar36 + (uVar76 ^ 0x20)) + 8) = (uVar67 ^ uVar88) + uVar108;
      uVar79 = uVar83 ^ uVar69;
      uVar88 = uVar75 ^ uVar66;
      uVar98 = uVar81 ^ uVar82;
      uVar99 = uVar86 ^ uVar105;
      uVar71 = (uVar52 ^ uVar71) + uVar94;
      uVar67 = (uVar72 ^ uVar67) + uVar95;
      *(ulong *)(puVar36 + (uVar76 ^ 0x30)) = uVar52 + uVar94;
      *(ulong *)((long)(puVar36 + (uVar76 ^ 0x30)) + 8) = uVar72 + uVar95;
      *(ulong *)(puVar36 + uVar76) = uVar71;
      *(ulong *)((long)(puVar36 + uVar76) + 8) = uVar67;
      uVar75 = (ulong)((int)uVar78 + (int)lVar80 * 2 & 0x7ffffffe) | 0x80000001;
      local_1a8 = uVar85 % uVar75 << 0x20 | uVar85 / uVar75 & 0xffffffff;
      dVar100 = SQRT((double)(local_1a8 + uVar78 >> 0xc | 0x3ff0000000000000));
      uVar75 = (ulong)dVar100 >> 0x14;
      uVar86 = (ulong)dVar100 >> 0x13;
      lVar80 = uVar86 + (((uVar86 - uVar75) + -0x3fdffffffff) * (uVar75 - 0x3fe00000000) <
                        local_1a8 + uVar78);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar70;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar78;
      uVar72 = SUB168(auVar42 * auVar46,8);
      uVar68 = SUB168(auVar42 * auVar46,0);
      uVar75 = *(ulong *)(puVar38 + (uVar84 ^ 0x20));
      uVar86 = *(ulong *)((long)(puVar38 + (uVar84 ^ 0x20)) + 8);
      uVar52 = *(ulong *)(puVar38 + (uVar84 ^ 0x10));
      uVar101 = *(ulong *)((long)(puVar38 + (uVar84 ^ 0x10)) + 8);
      lVar47 = *(long *)((long)(puVar38 + (uVar84 ^ 0x30)) + 8);
      uVar94 = uVar87 ^ uVar71;
      uVar95 = uVar1 ^ uVar67;
      *(ulong *)(puVar38 + (uVar84 ^ 0x10)) = uVar102 + *(long *)(puVar38 + (uVar84 ^ 0x30));
      *(ulong *)((long)(puVar38 + (uVar84 ^ 0x10)) + 8) = uVar103 + lVar47;
      *(ulong *)(puVar38 + (uVar84 ^ 0x20)) = (uVar72 ^ uVar52) + uVar109;
      *(ulong *)((long)(puVar38 + (uVar84 ^ 0x20)) + 8) = (uVar68 ^ uVar101) + uVar110;
      *(ulong *)(puVar38 + (uVar84 ^ 0x30)) = uVar75 + uVar104;
      *(ulong *)((long)(puVar38 + (uVar84 ^ 0x30)) + 8) = uVar86 + uVar106;
      uVar104 = (uVar75 ^ uVar72) + uVar104;
      uVar106 = (uVar86 ^ uVar68) + uVar106;
      *(ulong *)(puVar38 + uVar84) = uVar104;
      *(ulong *)((long)(puVar38 + uVar84) + 8) = uVar106;
      uVar104 = uVar70 ^ uVar104;
      uVar106 = uVar2 ^ uVar106;
      uVar65 = uVar65 - 1;
      uVar102 = uVar109;
      uVar103 = uVar110;
      uVar101 = uVar107;
      uVar68 = uVar108;
      local_1d8 = uVar92;
      uStack_1d0 = uVar93;
      local_188 = uVar90;
      uStack_180 = uVar91;
    } while (uVar65 != 0);
  }
  lVar73 = 0;
  do {
    pcVar31 = ctx[lVar73];
    cn_implode_scratchpad<true>((__m128i *)pcVar31->memory,(__m128i *)pcVar31);
    keccakf((uint64_t *)pcVar31,0x18);
    (*(code *)(&extra_hashes)[(byte)*(longlong *)pcVar31->state & 3])(pcVar31,200,output);
    lVar73 = lVar73 + 1;
    output = output + 0x20;
  } while (lVar73 != 4);
  return;
}

Assistant:

inline void cryptonight_quad_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    for (size_t i = 0; i < 4; i++) {
        keccak(input + size * i, size, ctx[i]->state);
        cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->state), reinterpret_cast<__m128i*>(ctx[i]->memory));
    }

    uint8_t* l0  = ctx[0]->memory;
    uint8_t* l1  = ctx[1]->memory;
    uint8_t* l2  = ctx[2]->memory;
    uint8_t* l3  = ctx[3]->memory;
    uint64_t* h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t* h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);
    uint64_t* h2 = reinterpret_cast<uint64_t*>(ctx[2]->state);
    uint64_t* h3 = reinterpret_cast<uint64_t*>(ctx[3]->state);

    CONST_INIT(ctx[0], 0);
    CONST_INIT(ctx[1], 1);
    CONST_INIT(ctx[2], 2);
    CONST_INIT(ctx[3], 3);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t idx0, idx1, idx2, idx3;
    idx0 = _mm_cvtsi128_si64(ax0);
    idx1 = _mm_cvtsi128_si64(ax1);
    idx2 = _mm_cvtsi128_si64(ax2);
    idx3 = _mm_cvtsi128_si64(ax3);

    for (size_t i = 0; i < iters; i++) {
        uint64_t hi, lo;
        __m128i *ptr0, *ptr1, *ptr2, *ptr3;

        CN_STEP1(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP1(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP1(ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP1(ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP2(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP2(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP2(ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP2(ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP3(0, ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP3(1, ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP3(2, ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP3(3, ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP4(0, ax0, bx00, bx01, cx0, l0, mc0, ptr0, idx0);
        CN_STEP4(1, ax1, bx10, bx11, cx1, l1, mc1, ptr1, idx1);
        CN_STEP4(2, ax2, bx20, bx21, cx2, l2, mc2, ptr2, idx2);
        CN_STEP4(3, ax3, bx30, bx31, cx3, l3, mc3, ptr3, idx3);
    }

    for (size_t i = 0; i < 4; i++) {
        cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->memory), reinterpret_cast<__m128i*>(ctx[i]->state));
        keccakf(reinterpret_cast<uint64_t*>(ctx[i]->state), 24);
        extra_hashes[ctx[i]->state[0] & 3](ctx[i]->state, 200, output + 32 * i);
    }
}